

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.h
# Opt level: O0

char * __thiscall
btHingeConstraint::serialize(btHingeConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btTransform *in_RSI;
  btTransformFloatData *in_RDI;
  btScalar bVar1;
  btSerializer *unaff_retaddr;
  btHingeConstraintFloatData *hingeData;
  
  btTypedConstraint::serialize((btTypedConstraint *)serializer,hingeData,unaff_retaddr);
  btTransform::serialize(in_RSI,in_RDI);
  btTransform::serialize(in_RSI,in_RDI);
  in_RSI[3].m_basis.m_el[0].m_floats[1] =
       (btScalar)(uint)(*(byte *)(in_RDI[0xb].m_origin.m_floats + 2) & 1);
  in_RSI[3].m_basis.m_el[0].m_floats[2] =
       (btScalar)(uint)(*(byte *)((long)in_RDI[0xb].m_origin.m_floats + 9) & 1);
  in_RSI[3].m_basis.m_el[1].m_floats[0] = in_RDI[0xb].m_basis.m_el[0].m_floats[1];
  in_RSI[3].m_basis.m_el[0].m_floats[3] = in_RDI[0xb].m_basis.m_el[0].m_floats[0];
  in_RSI[3].m_basis.m_el[0].m_floats[0] =
       (btScalar)(uint)(*(byte *)(in_RDI[0xb].m_origin.m_floats + 3) & 1);
  bVar1 = btAngularLimit::getLow((btAngularLimit *)0x2118f6);
  in_RSI[3].m_basis.m_el[1].m_floats[1] = bVar1;
  bVar1 = btAngularLimit::getHigh((btAngularLimit *)0x211913);
  in_RSI[3].m_basis.m_el[1].m_floats[2] = bVar1;
  bVar1 = btAngularLimit::getSoftness((btAngularLimit *)(in_RDI[0xb].m_basis.m_el[0].m_floats + 2));
  in_RSI[3].m_basis.m_el[1].m_floats[3] = bVar1;
  bVar1 = btAngularLimit::getBiasFactor
                    ((btAngularLimit *)(in_RDI[0xb].m_basis.m_el[0].m_floats + 2));
  in_RSI[3].m_basis.m_el[2].m_floats[0] = bVar1;
  bVar1 = btAngularLimit::getRelaxationFactor
                    ((btAngularLimit *)(in_RDI[0xb].m_basis.m_el[0].m_floats + 2));
  in_RSI[3].m_basis.m_el[2].m_floats[1] = bVar1;
  return "btHingeConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btHingeConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btHingeConstraintData* hingeData = (btHingeConstraintData*)dataBuffer;
	btTypedConstraint::serialize(&hingeData->m_typeConstraintData,serializer);

	m_rbAFrame.serialize(hingeData->m_rbAFrame);
	m_rbBFrame.serialize(hingeData->m_rbBFrame);

	hingeData->m_angularOnly = m_angularOnly;
	hingeData->m_enableAngularMotor = m_enableAngularMotor;
	hingeData->m_maxMotorImpulse = float(m_maxMotorImpulse);
	hingeData->m_motorTargetVelocity = float(m_motorTargetVelocity);
	hingeData->m_useReferenceFrameA = m_useReferenceFrameA;
#ifdef	_BT_USE_CENTER_LIMIT_
	hingeData->m_lowerLimit = float(m_limit.getLow());
	hingeData->m_upperLimit = float(m_limit.getHigh());
	hingeData->m_limitSoftness = float(m_limit.getSoftness());
	hingeData->m_biasFactor = float(m_limit.getBiasFactor());
	hingeData->m_relaxationFactor = float(m_limit.getRelaxationFactor());
#else
	hingeData->m_lowerLimit = float(m_lowerLimit);
	hingeData->m_upperLimit = float(m_upperLimit);
	hingeData->m_limitSoftness = float(m_limitSoftness);
	hingeData->m_biasFactor = float(m_biasFactor);
	hingeData->m_relaxationFactor = float(m_relaxationFactor);
#endif

	return btHingeConstraintDataName;
}